

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_engine.cpp
# Opt level: O0

int zmq::udp_engine_t::set_udp_multicast_ttl(fd_t s_,bool is_ipv6_,int hops_)

{
  int iVar1;
  byte in_SIL;
  int in_EDI;
  int unaff_retaddr;
  int rc;
  int level;
  int local_10;
  undefined1 local_c [7];
  byte local_5;
  
  local_5 = in_SIL & 1;
  if (local_5 == 0) {
    local_10 = 0;
  }
  else {
    local_10 = 0x29;
  }
  iVar1 = setsockopt(in_EDI,local_10,0x21,local_c,4);
  assert_success_or_recoverable(rc,unaff_retaddr);
  return iVar1;
}

Assistant:

int zmq::udp_engine_t::set_udp_multicast_ttl (fd_t s_, bool is_ipv6_, int hops_)
{
    int level;

    if (is_ipv6_) {
        level = IPPROTO_IPV6;
    } else {
        level = IPPROTO_IP;
    }

    const int rc =
      setsockopt (s_, level, IP_MULTICAST_TTL,
                  reinterpret_cast<char *> (&hops_), sizeof (hops_));
    assert_success_or_recoverable (s_, rc);
    return rc;
}